

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O0

__m128i highbd_calculate_dqcoeff(__m128i qcoeff,__m128i dequant,int log_scale)

{
  longlong in_RCX;
  ulong uVar1;
  longlong in_RDX;
  longlong extraout_RDX;
  longlong in_RSI;
  undefined1 *puVar2;
  longlong in_RDI;
  undefined1 *puVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  __m128i alVar5;
  __m128i sign;
  __m128i sign_00;
  __m128i a;
  __m128i a_00;
  __m128i abs_coeff;
  __m128i coeff_sign;
  __m128i *in_stack_00000020;
  undefined1 local_78 [16];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  uint local_4c;
  undefined1 local_48 [44];
  undefined4 local_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  puVar3 = local_78;
  local_4c = (uint)in_RDI;
  local_1c = 0x1f;
  local_18 = (int)in_XMM0_Qa;
  iStack_14 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_10 = (int)in_XMM0_Qb;
  iStack_c = (int)((ulong)in_XMM0_Qb >> 0x20);
  auVar4 = ZEXT416(0x1f);
  local_68 = local_18 >> auVar4;
  iStack_64 = iStack_14 >> auVar4;
  iStack_60 = iStack_10 >> auVar4;
  iStack_5c = iStack_c >> auVar4;
  sign[1] = in_RCX;
  sign[0] = in_RDX;
  a[1] = in_RSI;
  a[0] = in_RDI;
  invert_sign_32_sse2(a,sign);
  uVar1 = (ulong)local_4c;
  puVar2 = local_48;
  highbd_mul_shift_sse2
            (in_stack_00000020,(__m128i *)coeff_sign[1],(__m128i *)coeff_sign[0],abs_coeff[1]._4_4_)
  ;
  sign_00[1] = uVar1;
  sign_00[0] = extraout_RDX;
  a_00[1] = (longlong)puVar2;
  a_00[0] = (longlong)puVar3;
  alVar5 = invert_sign_32_sse2(a_00,sign_00);
  alVar5[0] = alVar5[0];
  alVar5[1] = alVar5[1];
  return alVar5;
}

Assistant:

static inline __m128i highbd_calculate_dqcoeff(__m128i qcoeff, __m128i dequant,
                                               const int log_scale) {
  __m128i coeff_sign = _mm_srai_epi32(qcoeff, 31);
  __m128i abs_coeff = invert_sign_32_sse2(qcoeff, coeff_sign);
  highbd_mul_shift_sse2(&abs_coeff, &dequant, &abs_coeff, log_scale);
  return invert_sign_32_sse2(abs_coeff, coeff_sign);
}